

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

int __thiscall
Analysis::LexicalAnalysis::PreTokenize
          (LexicalAnalysis *this,vector<char,_std::allocator<char>_> *Code,
          vector<int,_std::allocator<int>_> *Table)

{
  char cVar1;
  int *piVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  bool bVar7;
  iterator iVar8;
  char *pcVar9;
  long lVar10;
  string brackets;
  string symbols;
  string operators;
  string quote;
  int local_bc;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48 [2];
  vector<char,_std::allocator<char>_> *local_38;
  
  local_78 = local_68;
  local_38 = Code;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"+-*/=","");
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"#\'$%&!/\\:.,;","");
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"(){}[]","");
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"\"","");
  pcVar9 = (local_38->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar9 != (local_38->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      lVar4 = local_70;
      plVar3 = local_78;
      if (local_70 != 0) {
        lVar10 = 0;
        do {
          if (*pcVar9 == *(char *)((long)plVar3 + lVar10)) {
            local_bc = 1;
            iVar8._M_current =
                 (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(Table,iVar8,&local_bc);
            }
            else {
              *iVar8._M_current = 1;
              (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_finish = iVar8._M_current + 1;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar4 != lVar10);
      }
      lVar4 = local_50;
      plVar3 = local_58;
      if (local_50 != 0) {
        lVar10 = 0;
        do {
          if (*pcVar9 == *(char *)((long)plVar3 + lVar10)) {
            local_bc = 7;
            iVar8._M_current =
                 (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(Table,iVar8,&local_bc);
            }
            else {
              *iVar8._M_current = 7;
              (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_finish = iVar8._M_current + 1;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar4 != lVar10);
      }
      lVar4 = local_90;
      plVar3 = local_98;
      if (local_90 != 0) {
        lVar10 = 0;
        do {
          if (*pcVar9 == *(char *)((long)plVar3 + lVar10)) {
            local_bc = 2;
            iVar8._M_current =
                 (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(Table,iVar8,&local_bc);
            }
            else {
              *iVar8._M_current = 2;
              (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_finish = iVar8._M_current + 1;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar4 != lVar10);
      }
      lVar4 = local_b0;
      plVar3 = local_b8;
      if (local_b0 != 0) {
        lVar10 = 0;
        do {
          if (*pcVar9 == *(char *)((long)plVar3 + lVar10)) {
            local_bc = 3;
            iVar8._M_current =
                 (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(Table,iVar8,&local_bc);
            }
            else {
              *iVar8._M_current = 3;
              (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_finish = iVar8._M_current + 1;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar4 != lVar10);
      }
      if (*pcVar9 == ' ') {
        local_bc = 6;
        iVar8._M_current =
             (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar8._M_current ==
            (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(Table,iVar8,&local_bc);
        }
        else {
          *iVar8._M_current = 6;
          (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar8._M_current + 1;
        }
      }
      cVar1 = *pcVar9;
      iVar5 = isalpha((int)cVar1);
      if (iVar5 == 0) {
        if ((int)cVar1 - 0x30U < 10) {
          local_bc = 5;
          iVar8._M_current =
               (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current !=
              (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            *iVar8._M_current = 5;
            goto LAB_00102d67;
          }
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(Table,iVar8,&local_bc);
        }
      }
      else {
        local_bc = 4;
        iVar8._M_current =
             (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar8._M_current ==
            (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(Table,iVar8,&local_bc);
        }
        else {
          *iVar8._M_current = 4;
LAB_00102d67:
          (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar8._M_current + 1;
        }
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != (local_38->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  piVar6 = (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (Table->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar6 != piVar2) {
    bVar7 = false;
    do {
      if (*piVar6 == 7) {
        bVar7 = (bool)(bVar7 ^ 1);
LAB_00102dca:
        *piVar6 = 10;
      }
      else if (bVar7) goto LAB_00102dca;
      piVar6 = piVar6 + 1;
    } while (piVar6 != piVar2);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return 0;
}

Assistant:

int LexicalAnalysis::PreTokenize(std::vector<char> &Code, std::vector<int> &Table) {

        std::string operators = "+-*/=";
        std::string symbols = "#'$%&!/\\:.,;";
        std::string brackets = "(){}[]";
        std::string quote = "\"";

        //check which type the char of the actual index is and
        //assign its type to the Table vector at a parallel index
        for (auto c = Code.cbegin(); c != Code.cend(); ++c) {
            for (auto o : operators) {
                if (*c == o) {
                    Table.push_back(op);
                }
            }
            for (auto q : quote) {
                if (*c == q) {
                    Table.push_back(quotes);
                }
            }
            for (auto s : symbols) {
                if (*c == s) {
                    Table.push_back(symbol);
                }
            }
            for (auto b : brackets) {
                if (*c == b) {
                    Table.push_back(bracket);
                }
            }

            if (*c == ' '){
                Table.push_back(empty);
            }
            if (std::isalpha(*c)) {
                Table.push_back(letter);
            } else if (std::isdigit(*c)) {
                Table.push_back(digit);
            }
        }

        int counter = 0;
        bool flag = false;
        for (int i : Table) {

            if (i == quotes) {
                flag = !flag;
                Table[counter] = 10;
            } else if (flag == true) {
                Table[counter] = 10;
            }
            counter++;
        }
        return 0;
    }